

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  luaK_exp2anyreg(fs,e);
  iVar1 = (e->u).info;
  if (e->k == VNONRELOC) {
    iVar2 = luaY_nvarstack(fs);
    if (iVar2 <= iVar1) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  *(uint *)&e->u = (uint)fs->freereg;
  e->k = VNONRELOC;
  luaK_checkstack(fs,2);
  fs->freereg = fs->freereg + '\x02';
  iVar2 = (e->u).info;
  iVar3 = exp2RK(fs,key);
  luaK_code(fs,(key->u).info << 0x18 | iVar3 << 0xf | iVar1 << 0x10 | iVar2 << 7 | 0x14);
  if (key->k == VNONRELOC) {
    iVar1 = (key->u).info;
    iVar2 = luaY_nvarstack(fs);
    if (iVar2 <= iVar1) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int ereg;
  luaK_exp2anyreg(fs, e);
  ereg = e->u.info;  /* register where 'e' was placed */
  freeexp(fs, e);
  e->u.info = fs->freereg;  /* base register for op_self */
  e->k = VNONRELOC;  /* self expression has a fixed register */
  luaK_reserveregs(fs, 2);  /* function and 'self' produced by op_self */
  codeABRK(fs, OP_SELF, e->u.info, ereg, key);
  freeexp(fs, key);
}